

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_nbcd_8_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint value;
  uint uVar4;
  int iVar5;
  
  uVar2 = m68ki_read_imm_16();
  uVar3 = m68ki_read_8_fc((int)(short)uVar2,m68ki_address_space | m68ki_cpu.s_flag);
  iVar5 = ((int)(m68ki_cpu.x_flag << 0x17) >> 0x1f) - uVar3;
  value = 0x9a;
  uVar1 = iVar5 + 0x9a;
  uVar4 = uVar1 & 0xff;
  if (uVar4 == 0x9a) {
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
  }
  else {
    value = iVar5 + 0xaaU & 0xf0;
    if ((uVar1 & 0xf) != 10) {
      value = uVar4;
    }
    m68ki_cpu.v_flag = ~uVar4 & value;
    m68ki_write_8_fc((int)(short)uVar2,m68ki_cpu.s_flag | 1,value);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | value;
    m68ki_cpu.c_flag = 0x100;
  }
  m68ki_cpu.x_flag = m68ki_cpu.c_flag;
  m68ki_cpu.n_flag = value;
  return;
}

Assistant:

static void m68k_op_nbcd_8_aw(void)
{
	uint ea = EA_AW_8();
	uint dst = m68ki_read_8(ea);
	uint res = MASK_OUT_ABOVE_8(0x9a - dst - XFLAG_AS_1());

	if(res != 0x9a)
	{
		FLAG_V = ~res; /* Undefined V behavior */

		if((res & 0x0f) == 0xa)
			res = (res & 0xf0) + 0x10;

		res = MASK_OUT_ABOVE_8(res);

		FLAG_V &= res; /* Undefined V behavior part II */

		m68ki_write_8(ea, MASK_OUT_ABOVE_8(res));

		FLAG_Z |= res;
		FLAG_C = CFLAG_SET;
		FLAG_X = XFLAG_SET;
	}
	else
	{
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;
		FLAG_X = XFLAG_CLEAR;
	}
	FLAG_N = NFLAG_8(res);	/* Undefined N behavior */
}